

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O3

size_t u32Weight(u32 w)

{
  uint uVar1;
  
  uVar1 = w - (w >> 1 & 0x55555555);
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
  uVar1 = (uVar1 >> 4) + uVar1 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 8) + uVar1;
  return (ulong)((uVar1 >> 0x10) + uVar1 & 0xff);
}

Assistant:

size_t u32Weight(register u32 w)
{
	w -= ((w >> 1) & 0x55555555);
	w = (w & 0x33333333) + ((w >> 2) & 0x33333333);
	w = (w + (w >> 4)) & 0x0F0F0F0F;
	w += w >> 8;
	w += w >> 16;
	return (size_t)(w & 0x0000003F);
}